

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
::matches(Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
          *this,candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                candidate)

{
  UnaryOp UVar1;
  BinaryOp BVar2;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> pBVar3;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  *pMVar4;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar5;
  matched_t<wasm::Const_*> pCVar6;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar7;
  matched_t<wasm::Const_*> *ppCVar8;
  bool bVar9;
  UnaryOp UVar10;
  BinaryOp BVar11;
  Literal local_38;
  
  if (candidate->_id == UnaryId) {
    if (this->binder !=
        (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_> *)
        0x0) {
      *this->binder =
           (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>)
           candidate;
    }
    UVar1 = *(UnaryOp *)(candidate + 1);
    UVar10 = AbstractUnaryOpK::getOp((Type)*(uintptr_t *)(candidate[1].type.id + 8),this->data);
    if ((UVar1 == UVar10) &&
       (pBVar3 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                  )candidate[1].type.id,
       (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId
       )) {
      pMVar4 = (this->submatchers).curr;
      if (pMVar4->binder !=
          (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
           *)0x0) {
        *pMVar4->binder = pBVar3;
      }
      BVar2 = pBVar3->op;
      BVar11 = Abstract::getBinary((Type)(pBVar3->left->type).id,pMVar4->data);
      if (BVar2 == BVar11) {
        ppEVar5 = ((pMVar4->submatchers).curr)->binder;
        if (ppEVar5 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
          *ppEVar5 = pBVar3->left;
        }
        pCVar6 = (matched_t<wasm::Const_*>)pBVar3->right;
        if ((pCVar6->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
            ConstId) {
          pMVar7 = (pMVar4->submatchers).next.curr;
          ppCVar8 = pMVar7->binder;
          if (ppCVar8 != (matched_t<wasm::Const_*> *)0x0) {
            *ppCVar8 = pCVar6;
          }
          Literal::Literal(&local_38,&pCVar6->value);
          bVar9 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches(&(pMVar7->submatchers).curr,&local_38);
          Literal::~Literal(&local_38);
          return bVar9;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }